

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

MemberSyntax * __thiscall slang::parsing::Parser::parseClockingItem(Parser *this)

{
  SyntaxFactory *this_00;
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  ClockingSkewSyntax *inputSkew;
  ClockingSkewSyntax *outputSkew;
  DefaultSkewItemSyntax *pDVar4;
  MemberSyntax *pMVar5;
  AttributeSpecSyntax *pAVar6;
  undefined4 extraout_var;
  ClockingItemSyntax *pCVar7;
  uint uVar8;
  Info *extraout_RDX;
  Info *src;
  ulong uVar9;
  TokenKind kind;
  Token TVar10;
  string_view sVar11;
  Token TVar12;
  Token TVar13;
  Token semi;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> decls;
  Token local_170;
  Token local_160;
  Token local_150;
  Token local_140;
  ClockingDirectionSyntax *local_130;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_128;
  ulong local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  Token local_f0;
  undefined1 local_e0 [24];
  undefined1 auStack_c8 [24];
  __extent_storage<18446744073709551615UL> local_b0;
  Token local_68;
  SyntaxNode *local_58;
  SyntaxNode *pSStack_50;
  pointer local_40;
  
  Token::Token(&local_160);
  TVar10 = ParserBase::peek(&this->super_ParserBase);
  uVar8 = TVar10.kind - 0xc1;
  if ((0x26 < uVar8) || ((0x4000000003U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) {
    if (TVar10.kind != DefaultKeyword) {
      pMVar5 = parseSingleMember(this,ClockingItem);
      return pMVar5;
    }
    local_160 = ParserBase::consume(&this->super_ParserBase);
  }
  Token::Token(&local_170);
  Token::Token(&local_150);
  bVar1 = ParserBase::peek(&this->super_ParserBase,InOutKeyword);
  if (bVar1) {
    local_170 = ParserBase::consume(&this->super_ParserBase);
    if (local_160.info != (Info *)0x0) {
      SVar3 = Token::location(&local_170);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x620005,SVar3);
    }
    outputSkew = (ClockingSkewSyntax *)0x0;
    inputSkew = (ClockingSkewSyntax *)0x0;
  }
  else {
    bVar1 = ParserBase::peek(&this->super_ParserBase,InputKeyword);
    if (bVar1) {
      local_170 = ParserBase::consume(&this->super_ParserBase);
      inputSkew = parseClockingSkew(this);
      if ((inputSkew == (ClockingSkewSyntax *)0x0) && (local_160.info != (Info *)0x0)) {
        SVar3 = Token::location(&local_170);
        sVar11 = Token::rawText(&local_170);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x330005,
                            (SourceLocation)((long)SVar3 + sVar11._M_len * 0x10000000));
        goto LAB_001e573a;
      }
    }
    else {
LAB_001e573a:
      inputSkew = (ClockingSkewSyntax *)0x0;
    }
    bVar1 = ParserBase::peek(&this->super_ParserBase,OutputKeyword);
    if (bVar1) {
      local_150 = ParserBase::consume(&this->super_ParserBase);
      outputSkew = parseClockingSkew(this);
      if ((outputSkew == (ClockingSkewSyntax *)0x0) && (local_160.info != (Info *)0x0)) {
        SVar3 = Token::location(&local_150);
        sVar11 = Token::rawText(&local_150);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x330005,
                            (SourceLocation)((long)SVar3 + sVar11._M_len * 0x10000000));
        goto LAB_001e57a7;
      }
    }
    else {
LAB_001e57a7:
      outputSkew = (ClockingSkewSyntax *)0x0;
    }
    if (((local_160.info != (Info *)0x0) && (local_170.info == (Info *)0x0)) &&
       (local_150.info == (Info *)0x0)) {
      SVar3 = Token::location(&local_160);
      sVar11 = Token::valueText(&local_160);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x330005,
                          (SourceLocation)((long)SVar3 + sVar11._M_len * 0x10000000));
    }
  }
  this_00 = &this->factory;
  local_130 = syntax::SyntaxFactory::clockingDirection
                        (this_00,local_170,inputSkew,local_150,outputSkew);
  TVar10 = local_160;
  if (local_160.info != (Info *)0x0) {
    local_e0._8_4_ = SyntaxList;
    local_e0._16_8_ = (SyntaxNode *)0x0;
    auStack_c8._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
    auStack_c8._8_8_ = (Info *)0x0;
    auStack_c8._16_8_ = (pointer)0x0;
    local_b0._M_extent_value = 0;
    local_e0._0_8_ = &PTR_getChild_002f75e8;
    local_f0 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pDVar4 = syntax::SyntaxFactory::defaultSkewItem
                       (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_e0,
                        TVar10,local_130,local_f0);
    return &pDVar4->super_MemberSyntax;
  }
  Token::Token(&local_140);
  local_e0._0_8_ = auStack_c8;
  local_e0._8_8_ = 0;
  local_e0._16_8_ = (SyntaxNode *)0x4;
  TVar10 = ParserBase::peek(&this->super_ParserBase);
  local_68 = TVar10;
  bVar1 = syntax::SyntaxFacts::isSemicolon(TVar10.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location(&local_68);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x410005,SVar3);
    }
  }
  else {
    bVar1 = syntax::SyntaxFacts::isIdentifierOrComma(TVar10.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar10,Semicolon,&local_140,(DiagCode)0x410005);
      src = extraout_RDX;
      goto LAB_001e5aa4;
    }
    local_128._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseAttributeSpec(this)
    ;
    local_118 = CONCAT71(local_118._1_7_,1);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_e0,
               (TokenOrSyntax *)&local_128._M_first);
    TVar12 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = syntax::SyntaxFacts::isSemicolon(TVar12.kind);
    if (TVar12.kind == Comma && !bVar1) {
      do {
        local_128._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_118 = local_118 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_e0,
                   (TokenOrSyntax *)&local_128._M_first);
        TVar12 = ParserBase::peek(&this->super_ParserBase);
        kind = TVar12.kind;
        bVar1 = syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        if ((TVar10.info == TVar12.info && TVar10.kind == kind) &&
           (bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                              (&this->super_ParserBase,(DiagCode)0x410005,true), !bVar1)) break;
        pAVar6 = parseAttributeSpec(this);
        local_128._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pAVar6;
        local_118 = CONCAT71(local_118._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_e0,
                   (TokenOrSyntax *)&local_128._M_first);
        TVar13 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = syntax::SyntaxFacts::isSemicolon(TVar13.kind);
        uVar9 = TVar12._0_8_ & 0xffffffff;
        TVar10.info = TVar12.info;
        TVar10.kind = (short)uVar9;
        TVar10._2_1_ = (char)(uVar9 >> 0x10);
        TVar10.numFlags.raw = (char)(uVar9 >> 0x18);
        TVar10.rawLen = (int)(uVar9 >> 0x20);
      } while (TVar13.kind == Comma && !bVar1);
    }
  }
  local_140 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  src = local_140.info;
LAB_001e5aa4:
  local_128._8_4_ = 1;
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  local_128._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_002f75e8;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_e0,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_40 = (pointer)CONCAT44(extraout_var,iVar2);
  local_68.info._0_4_ = 3;
  local_58 = (SyntaxNode *)0x0;
  pSStack_50 = (SyntaxNode *)0x0;
  local_68._0_8_ = &PTR_getChild_002f7948;
  pCVar7 = syntax::SyntaxFactory::clockingItem
                     (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                              &local_128._M_first,local_130,
                      (SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)&local_68,local_140
                     );
  if ((pointer)local_e0._0_8_ != (pointer)auStack_c8) {
    operator_delete((void *)local_e0._0_8_);
  }
  return &pCVar7->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseClockingItem() {
    Token def;
    switch (peek().kind) {
        case TokenKind::DefaultKeyword:
            def = consume();
            break;
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
            break;
        default:
            return parseSingleMember(SyntaxKind::ClockingItem);
    }

    Token input, output;
    ClockingSkewSyntax* inputSkew = nullptr;
    ClockingSkewSyntax* outputSkew = nullptr;
    if (peek(TokenKind::InOutKeyword)) {
        input = consume();
        if (def)
            addDiag(diag::InOutDefaultSkew, input.location());
    }
    else {
        if (peek(TokenKind::InputKeyword)) {
            input = consume();
            inputSkew = parseClockingSkew();
            if (def && !inputSkew)
                addDiag(diag::ExpectedClockingSkew, input.location() + input.rawText().length());
        }

        if (peek(TokenKind::OutputKeyword)) {
            output = consume();
            outputSkew = parseClockingSkew();
            if (def && !outputSkew)
                addDiag(diag::ExpectedClockingSkew, output.location() + output.rawText().length());
        }

        if (def && !input && !output)
            addDiag(diag::ExpectedClockingSkew, def.location() + def.valueText().length());
    }

    auto& direction = factory.clockingDirection(input, inputSkew, output, outputSkew);
    if (def)
        return &factory.defaultSkewItem(nullptr, def, direction, expect(TokenKind::Semicolon));

    Token semi;
    SmallVector<TokenOrSyntax, 4> decls;
    parseList<isIdentifierOrComma, isSemicolon>(decls, TokenKind::Semicolon, TokenKind::Comma, semi,
                                                RequireItems::True, diag::ExpectedIdentifier,
                                                [this] { return &parseAttributeSpec(); });

    return &factory.clockingItem(nullptr, direction, decls.copy(alloc), semi);
}